

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall symbols::LenFunction::~LenFunction(LenFunction *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BuiltinFunction).super_BuiltinObject.super_Object._vptr_Object =
       (_func_int **)&PTR_type_00179d30;
  pcVar2 = (this->super_BuiltinFunction).func_name._M_dataplus._M_p;
  paVar1 = &(this->super_BuiltinFunction).func_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

LenFunction()
                :BuiltinFunction("len"){}